

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  Type *addr;
  uint uVar1;
  long lVar2;
  int iVar3;
  uint size;
  Type TVar4;
  Type TVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long local_58;
  uint local_4c;
  Type local_48;
  int *newBuckets;
  Type local_38;
  EntryType *newEntries;
  
  uVar1 = this->count;
  size = uVar1 * 2;
  newBuckets._4_4_ = 4;
  if ((8 < size) && (uVar7 = uVar1 & 0x7fffffff, newBuckets._4_4_ = uVar7, (uVar1 - 1 & uVar7) != 0)
     ) {
    iVar3 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    newBuckets._4_4_ = 2;
    if (uVar7 != 1) {
      newBuckets._4_4_ = 1 << (-((byte)iVar3 ^ 0x1f) & 0x1f);
    }
  }
  local_48.ptr = (int *)0x0;
  local_38.ptr = (SimpleHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                  *)0x0;
  addr = &this->entries;
  if (newBuckets._4_4_ == this->bucketCount) {
    local_38.ptr = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::Recycler>
              (local_38.ptr,(long)(int)size,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    TVar5.ptr = local_38.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->entries).ptr = TVar5.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->size = size;
    this->modFunctionIndex = 0x4b;
  }
  else {
    local_4c = size;
    Allocate(this,&local_48.ptr,&local_38.ptr,newBuckets._4_4_,size);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::Recycler>
              (local_38.ptr,(long)(int)size,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar8 = 8;
      lVar9 = 0;
      do {
        if (-2 < *(int *)((long)&((local_38.ptr)->
                                 super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                 ).
                                 super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                                 .
                                 super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
                                 .
                                 super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                                 .value.ptr + lVar8)) {
          lVar2 = *(long *)((long)local_38.ptr + lVar8 + -8);
          Memory::Recycler::WBSetBit((char *)&local_58);
          local_58 = lVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
          uVar6 = GetBucket(*(int *)(local_58 + 8) * 2 + 1,newBuckets._4_4_,this->modFunctionIndex);
          *(int *)((long)&((local_38.ptr)->
                          super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          ).
                          super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                          .
                          super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
                          .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.
                          value.ptr + lVar8) = local_48.ptr[(int)uVar6];
          local_48.ptr[(int)uVar6] = (int)lVar9;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar9 < this->count);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar1 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    TVar4.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar4.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    TVar5.ptr = local_38.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->entries).ptr = TVar5.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->bucketCount = newBuckets._4_4_;
    this->size = uVar1;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }